

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

ostream * pstore::file::operator<<(ostream *os,file_handle *fh)

{
  ostream *poVar1;
  string local_38;
  file_handle *local_18;
  file_handle *fh_local;
  ostream *os_local;
  
  local_18 = fh;
  fh_local = (file_handle *)os;
  poVar1 = std::operator<<(os,"{ file:\"");
  file_handle::path_abi_cxx11_(&local_38,local_18);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"\" }");
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, file_handle const & fh) {
            return os << R"({ file:")" << fh.path () << R"(" })";
        }